

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.cpp
# Opt level: O3

void __thiscall setup::icon_entry::load(icon_entry *this,istream *is,info *i)

{
  bitset<256UL> *lead_bytes;
  int iVar1;
  uint uVar2;
  close_setting cVar3;
  logger *plVar4;
  log_level lVar5;
  char buffer_4 [1];
  stored_flag_reader<flags<setup::icon_entry::flags_Enum_,_8UL>_> flagreader;
  undefined1 local_1a9;
  undefined1 local_1a8 [16];
  size_t local_198;
  stored_type local_190;
  _Base_bitset<1UL> local_188;
  size_t sStack_180;
  
  if ((i->version).value < 0x1030000) {
    std::istream::read((char *)is,(long)local_1a8);
  }
  lead_bytes = &(i->header).lead_bytes;
  util::encoded_string::load(is,&this->name,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->filename,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->parameters,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->working_dir,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->icon_file,i->codepage,lead_bytes);
  util::encoded_string::load(is,&this->comment,i->codepage,(bitset<256UL> *)0x0);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value < 0x5030500) {
    (this->app_user_model_id)._M_string_length = 0;
    *(this->app_user_model_id)._M_dataplus._M_p = '\0';
  }
  else {
    util::encoded_string::load(is,&this->app_user_model_id,i->codepage,(bitset<256UL> *)0x0);
  }
  if ((i->version).value < 0x6010000) {
    (this->app_user_model_toast_activator_clsid)._M_string_length = 0;
    *(this->app_user_model_toast_activator_clsid)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::resize((ulong)&this->app_user_model_toast_activator_clsid,'\x10');
    std::istream::read((char *)is,
                       (long)(this->app_user_model_toast_activator_clsid)._M_dataplus._M_p);
  }
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  iVar1 = util::load<int,util::little_endian>
                    (is,(ulong)(((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0)
                        * 0x10 + 0x10);
  this->icon_index = iVar1;
  uVar2 = (i->version).value;
  lVar5 = Info;
  if (0x10317ff < uVar2) {
    std::istream::read((char *)is,(long)local_1a8);
    uVar2 = (i->version).value;
    lVar5 = local_1a8._0_4_;
  }
  this->show_command = lVar5;
  if (uVar2 < 0x1030f00) {
    this->close_on_exit = NoSetting;
LAB_00138fdc:
    local_1a8._0_2_ = Debug;
  }
  else {
    std::istream::read((char *)is,(long)local_1a8);
    if ((local_1a8._0_8_ & 0xff) < 3) {
      cVar3 = *(close_setting *)
               ((anonymous_namespace)::stored_close_setting::values + (local_1a8._0_8_ & 0xff) * 4);
    }
    else {
      local_1a8._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 8),"Unexpected ",0xb);
      plVar4 = logger::operator<<((logger *)local_1a8,
                                  &enum_names<setup::icon_entry::close_setting>::name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&plVar4->buffer," value: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&plVar4->buffer);
      logger::~logger((logger *)local_1a8);
      cVar3 = NoSetting;
    }
    this->close_on_exit = cVar3;
    if ((i->version).value < 0x2000700) goto LAB_00138fdc;
    std::istream::read((char *)is,(long)local_1a8);
  }
  this->hotkey = local_1a8._0_2_;
  local_1a8._0_8_ =
       (ulong)(((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) * 0x10 + 0x10;
  local_198 = 0;
  local_190 = '\0';
  local_188._M_w = 0;
  sStack_180 = 0;
  local_1a8._8_8_ = is;
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,NeverUninstall);
  if ((i->version).value < 0x1031a00) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,RunMinimized);
  }
  stored_flag_reader<setup::icon_entry::flags_Enum_>::add
            ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,CreateOnlyIfFileExists)
  ;
  if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 1) == 0) {
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,UseAppPaths);
  }
  uVar2 = (i->version).value;
  if (0x50002ff < uVar2) {
    if (uVar2 < 0x6030000) {
      stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,FolderShortcut);
      if ((i->version).value < 0x5040200) goto LAB_001390c1;
    }
    stored_flag_reader<setup::icon_entry::flags_Enum_>::add
              ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,
               ExcludeFromShowInNewInstall);
    if (0x504ffff < (i->version).value) {
      stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,PreventPinning);
      if (0x600ffff < (i->version).value) {
        stored_flag_reader<setup::icon_entry::flags_Enum_>::add
                  ((stored_flag_reader<setup::icon_entry::flags_Enum_> *)local_1a8,
                   HasAppUserModelToastActivatorCLSID);
      }
    }
  }
LAB_001390c1:
  if ((sStack_180 == 3) && (local_1a8._0_8_ == 0x20)) {
    std::istream::read((char *)local_1a8._8_8_,(long)&local_1a9);
  }
  (this->options)._flags.super__Base_bitset<1UL>._M_w = local_188._M_w;
  return;
}

Assistant:

void icon_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(filename, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(parameters, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(working_dir, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(icon_file, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(comment, i.codepage);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(5, 3, 5)) {
		is >> util::encoded_string(app_user_model_id, i.codepage);
	} else {
		app_user_model_id.clear();
	}
	
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		const size_t guid_size = 16;
		app_user_model_toast_activator_clsid.resize(guid_size);
		is.read(&app_user_model_toast_activator_clsid[0], std::streamsize(guid_size));
	} else {
		app_user_model_toast_activator_clsid.clear();
	}
	
	load_version_data(is, i.version);
	
	icon_index = util::load<boost::int32_t>(is, i.version.bits());
	
	if(i.version >= INNO_VERSION(1, 3, 24)) {
		show_command = util::load<boost::int32_t>(is);
	} else {
		show_command = 1;
	}
	if(i.version >= INNO_VERSION(1, 3, 15)) {
		close_on_exit = stored_enum<stored_close_setting>(is).get();
	} else {
		close_on_exit = NoSetting;
	}
	
	if(i.version >= INNO_VERSION(2, 0, 7)) {
		hotkey = util::load<boost::uint16_t>(is);
	} else {
		hotkey = 0;
	}
	
	stored_flag_reader<flags> flagreader(is, i.version.bits());
	
	flagreader.add(NeverUninstall);
	if(i.version < INNO_VERSION(1, 3, 26)) {
		flagreader.add(RunMinimized);
	}
	flagreader.add(CreateOnlyIfFileExists);
	if(i.version.bits() != 16) {
		flagreader.add(UseAppPaths);
	}
	if(i.version >= INNO_VERSION(5, 0, 3) && i.version < INNO_VERSION(6, 3, 0)) {
		flagreader.add(FolderShortcut);
	}
	if(i.version >= INNO_VERSION(5, 4, 2)) {
		flagreader.add(ExcludeFromShowInNewInstall);
	}
	if(i.version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(PreventPinning);
	}
	if(i.version >= INNO_VERSION(6, 1, 0)) {
		flagreader.add(HasAppUserModelToastActivatorCLSID);
	}
	
	options = flagreader.finalize();
}